

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_gen_edge_face(REF_CELL ref_cell,REF_INT edge,REF_INT *face0,REF_INT *face1)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  REF_BOOL have_node1;
  REF_BOOL have_node0;
  REF_INT node1;
  REF_INT node0;
  REF_INT face;
  REF_INT *face1_local;
  REF_INT *face0_local;
  REF_INT edge_local;
  REF_CELL ref_cell_local;
  
  *face0 = -1;
  *face1 = -1;
  iVar1 = ref_cell->e2n[edge << 1];
  iVar2 = ref_cell->e2n[edge * 2 + 1];
  node1 = 0;
  do {
    if (ref_cell->face_per <= node1) {
      if (*face0 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x55a,"ref_cell_gen_edge_face","face0 not set");
        ref_cell_local._4_4_ = 1;
      }
      else if (*face1 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x55b,"ref_cell_gen_edge_face","face1 not set");
        ref_cell_local._4_4_ = 1;
      }
      else {
        ref_cell_local._4_4_ = 0;
      }
      return ref_cell_local._4_4_;
    }
    bVar3 = true;
    if (((iVar1 != ref_cell->f2n[node1 << 2]) &&
        (bVar3 = true, iVar1 != ref_cell->f2n[node1 * 4 + 1])) &&
       (bVar3 = true, iVar1 != ref_cell->f2n[node1 * 4 + 2])) {
      bVar3 = iVar1 == ref_cell->f2n[node1 * 4 + 3];
    }
    bVar4 = true;
    if (((iVar2 != ref_cell->f2n[node1 << 2]) &&
        (bVar4 = true, iVar2 != ref_cell->f2n[node1 * 4 + 1])) &&
       (bVar4 = true, iVar2 != ref_cell->f2n[node1 * 4 + 2])) {
      bVar4 = iVar2 == ref_cell->f2n[node1 * 4 + 3];
    }
    if ((bVar3) && (bVar4)) {
      if (*face0 == -1) {
        *face0 = node1;
      }
      else {
        if (*face1 != -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x554,"ref_cell_gen_edge_face","face1 set twice");
          return 1;
        }
        *face1 = node1;
      }
    }
    node1 = node1 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_gen_edge_face(REF_CELL ref_cell, REF_INT edge,
                                          REF_INT *face0, REF_INT *face1) {
  REF_INT face, node0, node1;
  REF_BOOL have_node0;
  REF_BOOL have_node1;

  *face0 = REF_EMPTY;
  *face1 = REF_EMPTY;

  node0 = ref_cell_e2n_gen(ref_cell, 0, edge);
  node1 = ref_cell_e2n_gen(ref_cell, 1, edge);

  for (face = 0; face < ref_cell_face_per(ref_cell); face++) {
    have_node0 = (node0 == ref_cell_f2n_gen(ref_cell, 0, face) ||
                  node0 == ref_cell_f2n_gen(ref_cell, 1, face) ||
                  node0 == ref_cell_f2n_gen(ref_cell, 2, face) ||
                  node0 == ref_cell_f2n_gen(ref_cell, 3, face));
    have_node1 = (node1 == ref_cell_f2n_gen(ref_cell, 0, face) ||
                  node1 == ref_cell_f2n_gen(ref_cell, 1, face) ||
                  node1 == ref_cell_f2n_gen(ref_cell, 2, face) ||
                  node1 == ref_cell_f2n_gen(ref_cell, 3, face));
    if (have_node0 && have_node1) {
      if ((*face0) == REF_EMPTY) {
        (*face0) = face;
      } else {
        RAS(REF_EMPTY == (*face1), "face1 set twice");
        (*face1) = face;
      }
    }
  }

  RAS(REF_EMPTY != (*face0), "face0 not set");
  RAS(REF_EMPTY != (*face1), "face1 not set");

  return REF_SUCCESS;
}